

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_file_time(char *file,wchar_t line,char *pathname,long t,long nsec,char type,
                           wchar_t recent)

{
  time_t tVar1;
  long in_RCX;
  char *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  char in_R9B;
  int in_stack_00000008;
  time_t now;
  stat st;
  wchar_t r;
  longlong filet_nsec;
  longlong filet;
  stat local_e0;
  int local_4c;
  undefined8 local_48;
  wchar_t local_4;
  
  assertion_count(in_RDI,in_ESI);
  local_4c = lstat(in_RDX,&local_e0);
  if (local_4c == 0) {
    if (in_R9B != 'a') {
      if (in_R9B == 'b') {
        local_e0.st_atim.tv_sec = 0;
      }
      else {
        local_e0.st_atim.tv_sec = local_e0.st_mtim.tv_sec;
        if (in_R9B != 'm') {
          fprintf(_stderr,"INTERNAL: Bad type %c for file time",(ulong)(uint)(int)in_R9B);
          exit(1);
        }
      }
    }
    local_48 = 0;
    if (in_R9B == 'b') {
      local_4 = L'\x01';
    }
    else {
      if (in_stack_00000008 == 0) {
        if (local_e0.st_atim.tv_sec != in_RCX) {
          failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,
                        "File %s has %ctime %lld.%09lld, expected %lld.%09lld",in_RDX,
                        (ulong)(uint)(int)in_R9B,local_e0.st_atim.tv_sec,0,in_RCX,0);
          failure_finish((void *)0x106122);
          return L'\0';
        }
      }
      else {
        tVar1 = time((time_t *)0x0);
        if ((local_e0.st_atim.tv_sec < tVar1 + -10) || (tVar1 + 1 < local_e0.st_atim.tv_sec)) {
          failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,
                        "File %s has %ctime %lld, %lld seconds ago\n",in_RDX,
                        (ulong)(uint)(int)in_R9B,local_e0.st_atim.tv_sec,
                        tVar1 - local_e0.st_atim.tv_sec);
          failure_finish((void *)0x106084);
          return L'\0';
        }
      }
      local_4 = L'\x01';
    }
  }
  else {
    failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"Can\'t stat %s\n",in_RDX);
    failure_finish((void *)0x105f25);
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
assertion_file_time(const char *file, int line,
    const char *pathname, long t, long nsec, char type, int recent)
{
	long long filet, filet_nsec;
	int r;

#if defined(_WIN32) && !defined(__CYGWIN__)
#define EPOC_TIME	(116444736000000000ULL)
	FILETIME fxtime, fbirthtime, fatime, fmtime;
	ULARGE_INTEGER wintm;
	HANDLE h;
	fxtime.dwLowDateTime = 0;
	fxtime.dwHighDateTime = 0;

	assertion_count(file, line);
	/* Note: FILE_FLAG_BACKUP_SEMANTICS applies to open
	 * a directory file. If not, CreateFile() will fail when
	 * the pathname is a directory. */
	h = CreateFile(pathname, FILE_READ_ATTRIBUTES, 0, NULL,
	    OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, NULL);
	if (h == INVALID_HANDLE_VALUE) {
		failure_start(file, line, "Can't access %s\n", pathname);
		failure_finish(NULL);
		return (0);
	}
	r = GetFileTime(h, &fbirthtime, &fatime, &fmtime);
	switch (type) {
	case 'a': fxtime = fatime; break;
	case 'b': fxtime = fbirthtime; break;
	case 'm': fxtime = fmtime; break;
	}
	CloseHandle(h);
	if (r == 0) {
		failure_start(file, line, "Can't GetFileTime %s\n", pathname);
		failure_finish(NULL);
		return (0);
	}
	wintm.LowPart = fxtime.dwLowDateTime;
	wintm.HighPart = fxtime.dwHighDateTime;
	filet = (wintm.QuadPart - EPOC_TIME) / 10000000;
	filet_nsec = ((wintm.QuadPart - EPOC_TIME) % 10000000) * 100;
	nsec = (nsec / 100) * 100; /* Round the request */
#else
	struct stat st;

	assertion_count(file, line);
	r = lstat(pathname, &st);
	if (r != 0) {
		failure_start(file, line, "Can't stat %s\n", pathname);
		failure_finish(NULL);
		return (0);
	}
	switch (type) {
	case 'a': filet = st.st_atime; break;
	case 'm': filet = st.st_mtime; break;
	case 'b': filet = 0; break;
	default: fprintf(stderr, "INTERNAL: Bad type %c for file time", type);
		exit(1);
	}
#if defined(__FreeBSD__)
	switch (type) {
	case 'a': filet_nsec = st.st_atimespec.tv_nsec; break;
	case 'b': filet = st.st_birthtime;
		filet_nsec = st.st_birthtimespec.tv_nsec; break;
	case 'm': filet_nsec = st.st_mtimespec.tv_nsec; break;
	default: fprintf(stderr, "INTERNAL: Bad type %c for file time", type);
		exit(1);
	}
	/* FreeBSD generally only stores to microsecond res, so round. */
	filet_nsec = (filet_nsec / 1000) * 1000;
	nsec = (nsec / 1000) * 1000;
#else
	filet_nsec = nsec = 0;	/* Generic POSIX only has whole seconds. */
	if (type == 'b') return (1); /* Generic POSIX doesn't have birthtime */
#if defined(__HAIKU__)
	if (type == 'a') return (1); /* Haiku doesn't have atime. */
#endif
#endif
#endif
	if (recent) {
		/* Check that requested time is up-to-date. */
		time_t now = time(NULL);
		if (filet < now - 10 || filet > now + 1) {
			failure_start(file, line,
			    "File %s has %ctime %lld, %lld seconds ago\n",
			    pathname, type, filet, now - filet);
			failure_finish(NULL);
			return (0);
		}
	} else if (filet != t || filet_nsec != nsec) {
		failure_start(file, line,
		    "File %s has %ctime %lld.%09lld, expected %lld.%09lld",
		    pathname, type, filet, filet_nsec, t, nsec);
		failure_finish(NULL);
		return (0);
	}
	return (1);
}